

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

string * __thiscall
BuildStatus::FormatProgressStatus_abi_cxx11_
          (string *__return_storage_ptr__,BuildStatus *this,char *progress_status_format,
          EdgeStatus status)

{
  double dVar1;
  double elapsed;
  int running_edges;
  char *local_78;
  char *s;
  char local_68 [4];
  int percent;
  char buf [32];
  string out;
  EdgeStatus status_local;
  char *progress_status_format_local;
  BuildStatus *this_local;
  
  std::__cxx11::string::string((string *)(buf + 0x18));
  for (local_78 = progress_status_format; *local_78 != '\0'; local_78 = local_78 + 1) {
    if (*local_78 == '%') {
      local_78 = local_78 + 1;
      switch(*local_78) {
      case '%':
        std::__cxx11::string::push_back((char)buf + '\x18');
        break;
      default:
        Fatal("unknown placeholder \'%%%c\' in $NINJA_STATUS",(ulong)(uint)(int)*local_78);
      case 'c':
        SlidingRateInfo::UpdateRate(&this->current_rate_,this->finished_edges_);
        dVar1 = SlidingRateInfo::rate(&this->current_rate_);
        SnprintfRate<32ul>(this,dVar1,(char (*) [32])local_68,"%.1f");
        std::__cxx11::string::operator+=((string *)(buf + 0x18),local_68);
        break;
      case 'e':
        dVar1 = RateInfo::Elapsed(&this->overall_rate_);
        snprintf(local_68,0x20,"%.3f",dVar1);
        std::__cxx11::string::operator+=((string *)(buf + 0x18),local_68);
        break;
      case 'f':
        snprintf(local_68,0x20,"%d",(ulong)(uint)this->finished_edges_);
        std::__cxx11::string::operator+=((string *)(buf + 0x18),local_68);
        break;
      case 'o':
        RateInfo::UpdateRate(&this->overall_rate_,this->finished_edges_);
        dVar1 = RateInfo::rate(&this->overall_rate_);
        SnprintfRate<32ul>(this,dVar1,(char (*) [32])local_68,"%.1f");
        std::__cxx11::string::operator+=((string *)(buf + 0x18),local_68);
        break;
      case 'p':
        snprintf(local_68,0x20,"%3i%%",
                 (ulong)(uint)((this->finished_edges_ * 100) / this->total_edges_));
        std::__cxx11::string::operator+=((string *)(buf + 0x18),local_68);
        break;
      case 'r':
        elapsed._0_4_ = this->started_edges_ - this->finished_edges_;
        if (status == kEdgeFinished) {
          elapsed._0_4_ = elapsed._0_4_ + 1;
        }
        snprintf(local_68,0x20,"%d",(ulong)elapsed._0_4_);
        std::__cxx11::string::operator+=((string *)(buf + 0x18),local_68);
        break;
      case 's':
        snprintf(local_68,0x20,"%d",(ulong)(uint)this->started_edges_);
        std::__cxx11::string::operator+=((string *)(buf + 0x18),local_68);
        break;
      case 't':
        snprintf(local_68,0x20,"%d",(ulong)(uint)this->total_edges_);
        std::__cxx11::string::operator+=((string *)(buf + 0x18),local_68);
        break;
      case 'u':
        snprintf(local_68,0x20,"%d",(ulong)(uint)(this->total_edges_ - this->started_edges_));
        std::__cxx11::string::operator+=((string *)(buf + 0x18),local_68);
      }
    }
    else {
      std::__cxx11::string::push_back((char)buf + '\x18');
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(buf + 0x18));
  std::__cxx11::string::~string((string *)(buf + 0x18));
  return __return_storage_ptr__;
}

Assistant:

string BuildStatus::FormatProgressStatus(
    const char* progress_status_format, EdgeStatus status) const {
  string out;
  char buf[32];
  int percent;
  for (const char* s = progress_status_format; *s != '\0'; ++s) {
    if (*s == '%') {
      ++s;
      switch (*s) {
      case '%':
        out.push_back('%');
        break;

        // Started edges.
      case 's':
        snprintf(buf, sizeof(buf), "%d", started_edges_);
        out += buf;
        break;

        // Total edges.
      case 't':
        snprintf(buf, sizeof(buf), "%d", total_edges_);
        out += buf;
        break;

        // Running edges.
      case 'r': {
        int running_edges = started_edges_ - finished_edges_;
        // count the edge that just finished as a running edge
        if (status == kEdgeFinished)
          running_edges++;
        snprintf(buf, sizeof(buf), "%d", running_edges);
        out += buf;
        break;
      }

        // Unstarted edges.
      case 'u':
        snprintf(buf, sizeof(buf), "%d", total_edges_ - started_edges_);
        out += buf;
        break;

        // Finished edges.
      case 'f':
        snprintf(buf, sizeof(buf), "%d", finished_edges_);
        out += buf;
        break;

        // Overall finished edges per second.
      case 'o':
        overall_rate_.UpdateRate(finished_edges_);
        SnprintfRate(overall_rate_.rate(), buf, "%.1f");
        out += buf;
        break;

        // Current rate, average over the last '-j' jobs.
      case 'c':
        current_rate_.UpdateRate(finished_edges_);
        SnprintfRate(current_rate_.rate(), buf, "%.1f");
        out += buf;
        break;

        // Percentage
      case 'p':
        percent = (100 * finished_edges_) / total_edges_;
        snprintf(buf, sizeof(buf), "%3i%%", percent);
        out += buf;
        break;

      case 'e': {
        double elapsed = overall_rate_.Elapsed();
        snprintf(buf, sizeof(buf), "%.3f", elapsed);
        out += buf;
        break;
      }

      default:
        Fatal("unknown placeholder '%%%c' in $NINJA_STATUS", *s);
        return "";
      }
    } else {
      out.push_back(*s);
    }
  }

  return out;
}